

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::
unordered_flat_set<unsigned_int,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
::unordered_flat_set<unsigned_int_const*>
          (unordered_flat_set<unsigned_int,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
           *this,uint *first,uint *last,size_type n,hasher *h,key_equal *pred,allocator_type *a)

{
  detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)this,n,h,pred,a);
  insert<unsigned_int_const*>(this,first,last);
  return;
}

Assistant:

unordered_flat_set(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_set(n, h, pred, a) {
        this->insert(first, last);
    }